

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.c
# Opt level: O3

void lexicon_entry_free(lex_entry_t *entry)

{
  if (entry->ortho != (char *)0x0) {
    ckd_free(entry->ortho);
  }
  if (entry->ci_acmod_id != (acmod_id_t *)0x0) {
    ckd_free(entry->ci_acmod_id);
  }
  if (entry->phone != (char **)0x0) {
    ckd_free(entry->phone);
  }
  ckd_free(entry);
  return;
}

Assistant:

void lexicon_entry_free(lex_entry_t *entry)
{
    if (entry->ortho)
        ckd_free(entry->ortho);
    if (entry->ci_acmod_id)
        ckd_free(entry->ci_acmod_id);
    if (entry->phone)
        ckd_free(entry->phone);
    ckd_free(entry);
    return;
}